

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iio.c
# Opt level: O2

void event_interrupt(iio_event_data *data)

{
  int different;
  int channel2;
  int channel;
  int direction;
  int type;
  int modifier;
  int chan_type;
  
  mraa_iio_event_extract_event
            (data,&chan_type,&modifier,&type,&direction,&channel,&channel2,&different);
  fprintf(_stdout,
          "event time %lld id %lld extracted chan_type %d modifier %d type %d direction %d channel %d channel2 %d different %d\n"
          ,data->timestamp,data->id,(ulong)(uint)chan_type,(ulong)(uint)modifier,(ulong)(uint)type,
          (ulong)(uint)direction,(ulong)(uint)channel,(ulong)(uint)channel2,(ulong)(uint)different);
  return;
}

Assistant:

void
event_interrupt(struct iio_event_data* data)
{
    int chan_type;
    int modifier;
    int type;
    int direction;
    int channel;
    int channel2;
    int different;
    mraa_iio_event_extract_event(data, &chan_type, &modifier, &type, &direction, &channel, &channel2, &different);

    fprintf(stdout,
            "event time %lld id %lld extracted chan_type %d modifier %d type %d direction %d "
            "channel %d channel2 %d different %d\n",
            data->timestamp, data->id, chan_type, modifier, type, direction, channel, channel2, different);
}